

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderDerivateTests.cpp
# Opt level: O2

TestInstance * __thiscall
vkt::sr::anon_unknown_0::TextureDerivateCase::createInstance
          (TextureDerivateCase *this,Context *context)

{
  Vector<float,_4> *b;
  PtrData<tcu::Texture2D,_de::DefaultDeleter<tcu::Texture2D>_> data;
  TriangleDerivateCaseInstance *this_00;
  Texture2D *pTVar1;
  TextureBinding *this_01;
  int y;
  int y_00;
  deUint32 internalFormat;
  int x;
  int x_00;
  undefined1 extraout_XMM0 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar7 [16];
  undefined1 extraout_XMM0_00 [16];
  undefined1 auVar8 [16];
  Texture2D *pTStack_e8;
  SharedPtr<vkt::sr::TextureBinding> testTexture;
  MovePtr<tcu::Texture2D,_de::DefaultDeleter<tcu::Texture2D>_> texture;
  PixelBufferAccess level0;
  undefined4 uStack_74;
  tcu local_60 [16];
  tcu local_50 [16];
  tcu local_40 [16];
  undefined1 auVar6 [16];
  
  this_00 = (TriangleDerivateCaseInstance *)operator_new(0x228);
  TriangleDerivateCaseInstance::TriangleDerivateCaseInstance
            (this_00,context,
             (this->super_TriangleDerivateCase).super_ShaderRenderCase.m_uniformSetup.
             super_UniqueBase<const_vkt::sr::UniformSetup,_de::DefaultDeleter<const_vkt::sr::UniformSetup>_>
             .m_data.ptr,&(this->super_TriangleDerivateCase).m_definitions,
             &(this->super_TriangleDerivateCase).m_values);
  (this_00->super_ShaderRenderCaseInstance).super_TestInstance._vptr_TestInstance =
       (_func_int **)&PTR__ShaderRenderCaseInstance_00bd1a58;
  texture.super_UniqueBase<tcu::Texture2D,_de::DefaultDeleter<tcu::Texture2D>_>.m_data.ptr =
       (Texture2D *)0x0;
  this_00[1].super_ShaderRenderCaseInstance.super_TestInstance._vptr_TestInstance =
       (_func_int **)&(this->super_TriangleDerivateCase).field_0x13c;
  internalFormat = 0x881a;
  if (this_00->m_definitions->precision == PRECISION_HIGHP) {
    internalFormat = 0x8814;
  }
  testTexture.m_ptr = (TextureBinding *)glu::mapGLInternalFormat(internalFormat);
  pTVar1 = (Texture2D *)operator_new(0x50);
  tcu::Texture2D::Texture2D(pTVar1,(TextureFormat *)&testTexture,99,0x85);
  level0.super_ConstPixelBufferAccess.m_format.order = R;
  level0.super_ConstPixelBufferAccess.m_format.type = SNORM_INT8;
  data._8_8_ = testTexture.m_ptr;
  data.ptr = pTStack_e8;
  de::details::UniqueBase<tcu::Texture2D,_de::DefaultDeleter<tcu::Texture2D>_>::assignData
            (&texture.super_UniqueBase<tcu::Texture2D,_de::DefaultDeleter<tcu::Texture2D>_>,data);
  de::details::UniqueBase<tcu::Texture2D,_de::DefaultDeleter<tcu::Texture2D>_>::~UniqueBase
            ((UniqueBase<tcu::Texture2D,_de::DefaultDeleter<tcu::Texture2D>_> *)&level0);
  tcu::Texture2D::allocLevel
            (texture.super_UniqueBase<tcu::Texture2D,_de::DefaultDeleter<tcu::Texture2D>_>.m_data.
             ptr,0);
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
            (&level0.super_ConstPixelBufferAccess,
             &(((texture.super_UniqueBase<tcu::Texture2D,_de::DefaultDeleter<tcu::Texture2D>_>.
                 m_data.ptr)->super_TextureLevelPyramid).m_access.
               super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
               _M_impl.super__Vector_impl_data._M_start)->super_ConstPixelBufferAccess);
  auVar2 = extraout_XMM0;
  for (y_00 = 0; y_00 < level0.super_ConstPixelBufferAccess.m_size.m_data[1]; y_00 = y_00 + 1) {
    auVar3._4_12_ = auVar2._4_12_;
    auVar3._0_4_ = (float)y_00 + 0.5;
    auVar7 = auVar3;
    for (x_00 = 0; x_00 < level0.super_ConstPixelBufferAccess.m_size.m_data[0]; x_00 = x_00 + 1) {
      auVar4._4_12_ = auVar7._4_12_;
      auVar4._0_4_ = (float)x_00 + 0.5;
      uStack_74 = auVar2._4_4_;
      auVar5._12_4_ = auVar7._12_4_;
      auVar5._0_8_ = auVar4._0_8_;
      auVar5._8_4_ = auVar7._4_4_;
      auVar7._8_8_ = auVar5._8_8_;
      auVar7._4_4_ = auVar3._0_4_;
      auVar7._0_4_ = auVar4._0_4_;
      auVar6._0_12_ = auVar7._0_12_;
      auVar6._12_4_ = uStack_74;
      auVar8._0_4_ = (float)level0.super_ConstPixelBufferAccess.m_size.m_data[0];
      auVar8._4_4_ = (float)level0.super_ConstPixelBufferAccess.m_size.m_data[1];
      auVar8._8_8_ = 0;
      auVar7 = divps(auVar6,auVar8);
      testTexture.m_ptr = auVar7._0_8_;
      testTexture.m_state._0_4_ = (auVar7._4_4_ + auVar7._0_4_) * 0.5;
      testTexture.m_state._4_4_ = 1.0 - testTexture.m_state._0_4_;
      b = (Vector<float,_4> *)
          this_00[1].super_ShaderRenderCaseInstance.super_TestInstance._vptr_TestInstance;
      tcu::operator-(local_60,b + 1,b);
      tcu::operator*(local_50,(Vector<float,_4> *)local_60,(Vector<float,_4> *)&testTexture);
      tcu::operator+(local_40,b,(Vector<float,_4> *)local_50);
      tcu::PixelBufferAccess::setPixel(&level0,(Vec4 *)local_40,x_00,y_00,0);
      auVar7 = extraout_XMM0_00;
    }
    auVar2 = auVar7;
  }
  this_01 = (TextureBinding *)operator_new(0x68);
  pTVar1 = texture.super_UniqueBase<tcu::Texture2D,_de::DefaultDeleter<tcu::Texture2D>_>.m_data.ptr;
  texture.super_UniqueBase<tcu::Texture2D,_de::DefaultDeleter<tcu::Texture2D>_>.m_data.ptr =
       (Texture2D *)0x0;
  level0.super_ConstPixelBufferAccess.m_format.order = R;
  level0.super_ConstPixelBufferAccess.m_format.type = SNORM_INT8;
  level0.super_ConstPixelBufferAccess.m_size.m_data[0] = 0;
  level0.super_ConstPixelBufferAccess.m_size.m_data[1] = 0;
  level0.super_ConstPixelBufferAccess.m_size.m_data[2] = 0;
  level0.super_ConstPixelBufferAccess.m_pitch.m_data[0] = 0;
  level0.super_ConstPixelBufferAccess.m_pitch.m_data[1]._0_1_ = 1;
  level0.super_ConstPixelBufferAccess._28_8_ = 0;
  level0.super_ConstPixelBufferAccess.m_data._4_1_ = 0;
  stack0xffffffffffffff6d = 0;
  TextureBinding::TextureBinding(this_01,pTVar1,(Sampler *)&level0);
  de::SharedPtr<vkt::sr::TextureBinding>::SharedPtr(&testTexture,this_01);
  std::
  vector<de::SharedPtr<vkt::sr::TextureBinding>,_std::allocator<de::SharedPtr<vkt::sr::TextureBinding>_>_>
  ::push_back(&(this_00->super_ShaderRenderCaseInstance).m_textures,&testTexture);
  de::SharedPtr<vkt::sr::TextureBinding>::~SharedPtr(&testTexture);
  de::details::UniqueBase<tcu::Texture2D,_de::DefaultDeleter<tcu::Texture2D>_>::~UniqueBase
            (&texture.super_UniqueBase<tcu::Texture2D,_de::DefaultDeleter<tcu::Texture2D>_>);
  return (TestInstance *)this_00;
}

Assistant:

TestInstance* TextureDerivateCase::createInstance (Context& context) const
{
	DE_ASSERT(m_uniformSetup != DE_NULL);
	return new TextureDerivateCaseInstance(context, *m_uniformSetup, m_definitions, m_values, m_textureValues);
}